

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O1

void Instruction::load(string *filename)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  istream *piVar4;
  long lVar5;
  int *piVar6;
  ulong addr;
  Instruction *pIVar7;
  undefined8 uVar8;
  int size;
  string tmp;
  string text;
  string line;
  ifstream input;
  char *local_2a0;
  long local_298;
  char local_290 [16];
  char *local_280;
  long local_278;
  char local_270 [16];
  long local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [16];
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,(string *)filename,_S_in);
  local_258 = local_248;
  local_250 = 0;
  local_248[0] = 0;
LAB_00109b65:
  do {
    do {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_258,cVar3);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
        if (local_258 != local_248) {
          operator_delete(local_258);
        }
        std::ifstream::close();
        std::ifstream::~ifstream(local_238);
        return;
      }
      lVar5 = std::__cxx11::string::find((char)(string *)&local_258,0x3a);
    } while (lVar5 == -1);
    std::__cxx11::string::substr((ulong)&local_2a0,(ulong)&local_258);
    pcVar2 = local_2a0;
    piVar6 = __errno_location();
    iVar1 = *piVar6;
    *piVar6 = 0;
    addr = strtoul(pcVar2,&local_280,0x10);
    if (local_280 == pcVar2) {
      std::__throw_invalid_argument("stoul");
LAB_00109da7:
      std::__throw_out_of_range("stoul");
      goto LAB_00109db3;
    }
    if (*piVar6 == 0) {
      *piVar6 = iVar1;
    }
    else if (*piVar6 == 0x22) goto LAB_00109da7;
    if (local_2a0 != local_290) {
      operator_delete(local_2a0);
    }
  } while (addr == 0);
  std::__cxx11::string::substr((ulong)&local_2a0,(ulong)&local_258);
  if ((local_298 != 0) &&
     (lVar5 = std::__cxx11::string::find((char)&local_2a0,0x3a), pcVar2 = local_2a0, lVar5 != -1)) {
    iVar1 = *piVar6;
    *piVar6 = 0;
    local_260 = lVar5;
    lVar5 = strtol(local_2a0,&local_280,10);
    if (local_280 != pcVar2) {
      size = (int)lVar5;
      if ((size == lVar5) && (*piVar6 != 0x22)) {
        if (*piVar6 == 0) {
          *piVar6 = iVar1;
        }
        if (0 < size) {
          std::__cxx11::string::substr((ulong)&local_280,(ulong)&local_2a0);
          if (local_278 != 0) {
            pIVar7 = get(addr,size);
            std::__cxx11::string::_M_assign((string *)&pIVar7->m_text);
          }
          if (local_280 != local_270) {
            operator_delete(local_280);
          }
        }
        goto LAB_00109d44;
      }
LAB_00109db3:
      std::__throw_out_of_range("stoi");
    }
    uVar8 = std::__throw_invalid_argument("stoi");
    std::ifstream::~ifstream(local_238);
    _Unwind_Resume(uVar8);
  }
LAB_00109d44:
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  goto LAB_00109b65;
}

Assistant:

void Instruction::load(std::string filename) {
	std::ifstream input(filename);

	for (std::string line; getline(input, line); ) {
		std::size_t n = line.find(':');
		if (n == std::string::npos)
			continue;

		Addr addr = std::stoul(line.substr(0, n), 0, 16);
		if (addr == 0)
			continue;

		std::string tmp = line.substr(n+1);
		if (tmp.empty())
			continue;

		n = tmp.find(':');
		if (n == std::string::npos)
			continue;

		int size = std::stoi(tmp);
		if (size <= 0)
			continue;

		std::string text = tmp.substr(n+1);
		if (text.empty())
			continue;

		Instruction* instr = Instruction::get(addr, size);
		instr->m_text = text;
	}

	input.close();
}